

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pce.c
# Opt level: O0

int pce_pack_16x16_sprite(uchar *buffer,void *data,int line_offset,int format)

{
  byte bVar1;
  byte local_b0;
  byte local_ac;
  byte local_a8;
  byte local_a4;
  byte local_a0;
  byte local_9c;
  byte local_98;
  byte local_94;
  byte local_90;
  byte local_8c;
  byte local_88;
  byte local_84;
  byte local_80;
  byte local_7c;
  byte local_78;
  byte local_74;
  uint *packed;
  uchar *ptr;
  uint local_38;
  uint mask;
  uint pixel;
  int cnt;
  int j;
  int i;
  int format_local;
  int line_offset_local;
  void *data_local;
  uchar *buffer_local;
  
  if (pass == 1) {
    buffer[0x70] = '\0';
    buffer[0x71] = '\0';
    buffer[0x72] = '\0';
    buffer[0x73] = '\0';
    buffer[0x74] = '\0';
    buffer[0x75] = '\0';
    buffer[0x76] = '\0';
    buffer[0x77] = '\0';
    buffer[0x78] = '\0';
    buffer[0x79] = '\0';
    buffer[0x7a] = '\0';
    buffer[0x7b] = '\0';
    buffer[0x7c] = '\0';
    buffer[0x7d] = '\0';
    buffer[0x7e] = '\0';
    buffer[0x7f] = '\0';
    buffer[0x60] = '\0';
    buffer[0x61] = '\0';
    buffer[0x62] = '\0';
    buffer[99] = '\0';
    buffer[100] = '\0';
    buffer[0x65] = '\0';
    buffer[0x66] = '\0';
    buffer[0x67] = '\0';
    buffer[0x68] = '\0';
    buffer[0x69] = '\0';
    buffer[0x6a] = '\0';
    buffer[0x6b] = '\0';
    buffer[0x6c] = '\0';
    buffer[0x6d] = '\0';
    buffer[0x6e] = '\0';
    buffer[0x6f] = '\0';
    buffer[0x50] = '\0';
    buffer[0x51] = '\0';
    buffer[0x52] = '\0';
    buffer[0x53] = '\0';
    buffer[0x54] = '\0';
    buffer[0x55] = '\0';
    buffer[0x56] = '\0';
    buffer[0x57] = '\0';
    buffer[0x58] = '\0';
    buffer[0x59] = '\0';
    buffer[0x5a] = '\0';
    buffer[0x5b] = '\0';
    buffer[0x5c] = '\0';
    buffer[0x5d] = '\0';
    buffer[0x5e] = '\0';
    buffer[0x5f] = '\0';
    buffer[0x40] = '\0';
    buffer[0x41] = '\0';
    buffer[0x42] = '\0';
    buffer[0x43] = '\0';
    buffer[0x44] = '\0';
    buffer[0x45] = '\0';
    buffer[0x46] = '\0';
    buffer[0x47] = '\0';
    buffer[0x48] = '\0';
    buffer[0x49] = '\0';
    buffer[0x4a] = '\0';
    buffer[0x4b] = '\0';
    buffer[0x4c] = '\0';
    buffer[0x4d] = '\0';
    buffer[0x4e] = '\0';
    buffer[0x4f] = '\0';
    buffer[0x30] = '\0';
    buffer[0x31] = '\0';
    buffer[0x32] = '\0';
    buffer[0x33] = '\0';
    buffer[0x34] = '\0';
    buffer[0x35] = '\0';
    buffer[0x36] = '\0';
    buffer[0x37] = '\0';
    buffer[0x38] = '\0';
    buffer[0x39] = '\0';
    buffer[0x3a] = '\0';
    buffer[0x3b] = '\0';
    buffer[0x3c] = '\0';
    buffer[0x3d] = '\0';
    buffer[0x3e] = '\0';
    buffer[0x3f] = '\0';
    buffer[0x20] = '\0';
    buffer[0x21] = '\0';
    buffer[0x22] = '\0';
    buffer[0x23] = '\0';
    buffer[0x24] = '\0';
    buffer[0x25] = '\0';
    buffer[0x26] = '\0';
    buffer[0x27] = '\0';
    buffer[0x28] = '\0';
    buffer[0x29] = '\0';
    buffer[0x2a] = '\0';
    buffer[0x2b] = '\0';
    buffer[0x2c] = '\0';
    buffer[0x2d] = '\0';
    buffer[0x2e] = '\0';
    buffer[0x2f] = '\0';
    buffer[0x10] = '\0';
    buffer[0x11] = '\0';
    buffer[0x12] = '\0';
    buffer[0x13] = '\0';
    buffer[0x14] = '\0';
    buffer[0x15] = '\0';
    buffer[0x16] = '\0';
    buffer[0x17] = '\0';
    buffer[0x18] = '\0';
    buffer[0x19] = '\0';
    buffer[0x1a] = '\0';
    buffer[0x1b] = '\0';
    buffer[0x1c] = '\0';
    buffer[0x1d] = '\0';
    buffer[0x1e] = '\0';
    buffer[0x1f] = '\0';
    buffer[0] = '\0';
    buffer[1] = '\0';
    buffer[2] = '\0';
    buffer[3] = '\0';
    buffer[4] = '\0';
    buffer[5] = '\0';
    buffer[6] = '\0';
    buffer[7] = '\0';
    buffer[8] = '\0';
    buffer[9] = '\0';
    buffer[10] = '\0';
    buffer[0xb] = '\0';
    buffer[0xc] = '\0';
    buffer[0xd] = '\0';
    buffer[0xe] = '\0';
    buffer[0xf] = '\0';
    if (format == 1) {
      mask = 0;
      packed = (uint *)data;
      for (cnt = 0; cnt < 0x10; cnt = cnt + 1) {
        for (pixel = 0; (int)pixel < 8; pixel = pixel + 1) {
          bVar1 = *(byte *)((long)packed + (long)(int)(pixel ^ 0xf));
          local_80 = (byte)(1 << ((byte)pixel & 0x1f));
          local_74 = local_80;
          if ((bVar1 & 1) == 0) {
            local_74 = 0;
          }
          buffer[(int)mask] = buffer[(int)mask] | local_74;
          local_78 = local_80;
          if ((bVar1 & 2) == 0) {
            local_78 = 0;
          }
          buffer[(int)(mask + 0x20)] = buffer[(int)(mask + 0x20)] | local_78;
          local_7c = local_80;
          if ((bVar1 & 4) == 0) {
            local_7c = 0;
          }
          buffer[(int)(mask + 0x40)] = buffer[(int)(mask + 0x40)] | local_7c;
          if ((bVar1 & 8) == 0) {
            local_80 = 0;
          }
          buffer[(int)(mask + 0x60)] = buffer[(int)(mask + 0x60)] | local_80;
        }
        for (pixel = 0; (int)pixel < 8; pixel = pixel + 1) {
          bVar1 = *(byte *)((long)packed + (long)(int)(pixel ^ 7));
          local_90 = (byte)(1 << ((byte)pixel & 0x1f));
          local_84 = local_90;
          if ((bVar1 & 1) == 0) {
            local_84 = 0;
          }
          buffer[(int)(mask + 1)] = buffer[(int)(mask + 1)] | local_84;
          local_88 = local_90;
          if ((bVar1 & 2) == 0) {
            local_88 = 0;
          }
          buffer[(int)(mask + 0x21)] = buffer[(int)(mask + 0x21)] | local_88;
          local_8c = local_90;
          if ((bVar1 & 4) == 0) {
            local_8c = 0;
          }
          buffer[(int)(mask + 0x41)] = buffer[(int)(mask + 0x41)] | local_8c;
          if ((bVar1 & 8) == 0) {
            local_90 = 0;
          }
          buffer[(int)(mask + 0x61)] = buffer[(int)(mask + 0x61)] | local_90;
        }
        packed = (uint *)((long)packed + (long)line_offset);
        mask = mask + 2;
      }
    }
    else if (format == 2) {
      mask = 0;
      for (cnt = 0; cnt < 0x10; cnt = cnt + 1) {
        local_38 = *(uint *)((long)data + (long)(int)mask * 4);
        for (pixel = 0; (int)pixel < 8; pixel = pixel + 1) {
          local_a0 = (byte)(1 << ((byte)pixel & 0x1f));
          local_94 = local_a0;
          if ((local_38 & 1) == 0) {
            local_94 = 0;
          }
          buffer[(int)(mask + 1)] = buffer[(int)(mask + 1)] | local_94;
          local_98 = local_a0;
          if ((local_38 & 2) == 0) {
            local_98 = 0;
          }
          buffer[(int)(mask + 0x21)] = buffer[(int)(mask + 0x21)] | local_98;
          local_9c = local_a0;
          if ((local_38 & 4) == 0) {
            local_9c = 0;
          }
          buffer[(int)(mask + 0x41)] = buffer[(int)(mask + 0x41)] | local_9c;
          if ((local_38 & 8) == 0) {
            local_a0 = 0;
          }
          buffer[(int)(mask + 0x61)] = buffer[(int)(mask + 0x61)] | local_a0;
          local_38 = local_38 >> 4;
        }
        local_38 = *(uint *)((long)data + (long)(int)(mask + 1) * 4);
        for (pixel = 0; (int)pixel < 8; pixel = pixel + 1) {
          local_b0 = (byte)(1 << ((byte)pixel & 0x1f));
          local_a4 = local_b0;
          if ((local_38 & 1) == 0) {
            local_a4 = 0;
          }
          buffer[(int)mask] = buffer[(int)mask] | local_a4;
          local_a8 = local_b0;
          if ((local_38 & 2) == 0) {
            local_a8 = 0;
          }
          buffer[(int)(mask + 0x20)] = buffer[(int)(mask + 0x20)] | local_a8;
          local_ac = local_b0;
          if ((local_38 & 4) == 0) {
            local_ac = 0;
          }
          buffer[(int)(mask + 0x40)] = buffer[(int)(mask + 0x40)] | local_ac;
          if ((local_38 & 8) == 0) {
            local_b0 = 0;
          }
          buffer[(int)(mask + 0x60)] = buffer[(int)(mask + 0x60)] | local_b0;
          local_38 = local_38 >> 4;
        }
        mask = mask + 2;
      }
    }
    else {
      error("Internal error: unsupported format passed to \'pack_16x16_sprite\'!");
    }
  }
  return 0x80;
}

Assistant:

int
pce_pack_16x16_sprite(unsigned char *buffer, void *data, int line_offset, int format)
{
	int i, j;
	int cnt;
	unsigned int   pixel, mask;
	unsigned char *ptr;
	unsigned int  *packed;

	/* pack the sprite only in the last pass */
	if (pass != LAST_PASS)
		return (128);

	/* clear buffer */
	memset(buffer, 0, 128);

	/* encode the sprite */
	switch (format) {
	case CHUNKY_TILE:
		/* 8-bit chunky format - from pcx */
		cnt = 0;
		ptr = (unsigned char *)data;

		for (i = 0; i < 16; i++) {
			/* right column */
			for (j = 0; j < 8; j++) {
				pixel = ptr[j ^ 0x0F];
				mask  = 1 << j;
				buffer[cnt]    |= (pixel & 0x01) ? mask : 0;
				buffer[cnt+32] |= (pixel & 0x02) ? mask : 0;
				buffer[cnt+64] |= (pixel & 0x04) ? mask : 0;
				buffer[cnt+96] |= (pixel & 0x08) ? mask : 0;
			}

			/* left column */
			for (j = 0; j < 8; j++) {
				pixel = ptr[j ^ 0x07];
				mask  = 1 << j;
				buffer[cnt+1]  |= (pixel & 0x01) ? mask : 0;
				buffer[cnt+33] |= (pixel & 0x02) ? mask : 0;
				buffer[cnt+65] |= (pixel & 0x04) ? mask : 0;
				buffer[cnt+97] |= (pixel & 0x08) ? mask : 0;
			}				
			ptr += line_offset;
			cnt += 2;
		}
		break;

	case PACKED_TILE:
		/* 4-bit packed format - from array */
		cnt = 0;
		packed = (unsigned int *)data;
	
		for (i = 0; i < 16; i++) {
			/* left column */
			pixel = packed[cnt];
	
			for (j = 0; j < 8; j++) {
				mask = 1 << j;
				buffer[cnt+1]  |= (pixel & 0x01) ? mask : 0;
				buffer[cnt+33] |= (pixel & 0x02) ? mask : 0;
				buffer[cnt+65] |= (pixel & 0x04) ? mask : 0;
				buffer[cnt+97] |= (pixel & 0x08) ? mask : 0;
				pixel >>= 4;
			}

			/* right column */
			pixel = packed[cnt + 1];
	
			for (j = 0; j < 8; j++) {
				mask = 1 << j;
				buffer[cnt]    |= (pixel & 0x01) ? mask : 0;
				buffer[cnt+32] |= (pixel & 0x02) ? mask : 0;
				buffer[cnt+64] |= (pixel & 0x04) ? mask : 0;
				buffer[cnt+96] |= (pixel & 0x08) ? mask : 0;
				pixel >>= 4;
			}
			cnt += 2;
		}
		break;

	default:
		/* other formats not supported */
		error("Internal error: unsupported format passed to 'pack_16x16_sprite'!");
		break;
	}

	/* ok */
	return (128);
}